

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

size_t printDisp8(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm,long MyNumber)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  char *pFormat;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') &&
     ((pMyDisasm->Reserved_).EVEX.tupletype != '\0')) {
    lVar2 = getDisp8N(pMyDisasm);
    lVar3 = 1;
    if (lVar2 != -1) {
      lVar3 = lVar2;
    }
    MyNumber = MyNumber * lVar3;
  }
  if ((((pMyDisasm->Reserved_).RM_ == 4) && ((pMyDisasm->Reserved_).BASE_ == 4)) &&
     (0x1f < (pMyDisasm->Reserved_).Architecture)) {
    if ((pMyDisasm->Instruction).Opcode == 0x8f) {
      iVar1 = (pMyDisasm->Reserved_).OperandSize;
      iVar5 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      lVar3 = (long)(iVar5 >> 3);
    }
    else {
      lVar3 = 0;
    }
    MyNumber = MyNumber + lVar3;
  }
  if (MyNumber < 0) {
    (pMyOperand->OpMnemonic + i)[0] = '-';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    pFormat = "%.4X";
    if (MyNumber + 0x7eU < 0xfe) {
      pFormat = "%.2X";
    }
    MyNumber = -MyNumber;
  }
  else {
    (pMyOperand->OpMnemonic + i)[0] = '+';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    pFormat = "%.4X";
    if ((ulong)MyNumber < 0x80) {
      pFormat = "%.2X";
    }
  }
  sVar4 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i + 1,pFormat,MyNumber);
  return sVar4 + i + 1;
}

Assistant:

size_t __bea_callspec__ printDisp8(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm, long MyNumber)
{
  size_t j;
  long N;

  if ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.tupletype != 0)) {
    N = getDisp8N(pMyDisasm);
    if (N != -1) MyNumber = MyNumber * N;
  }
  if ((GV.RM_ == 4) && (GV.BASE_ == 4) && (GV.Architecture >=32)) {
    MyNumber += specificPop(pMyDisasm);
  }
  if (MyNumber < 0) {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "-");
    #endif
    i++;
    j=i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j, getNumFormat(MyNumber), (Int64) ~MyNumber+1);
    #endif
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i ++;
    j=i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j, getNumFormat(MyNumber), (Int64) MyNumber);
    #endif
  }
  return i;
}